

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::ShowMetricsWindow::Funcs::GetTableRect(ImGuiTable *table,int rect_type,int n)

{
  ImGuiTableColumn *pIVar1;
  float fVar2;
  ImVec2 IVar3;
  float fVar4;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  ImRect IVar8;
  
  switch(rect_type) {
  case 0:
    IVar3 = (table->OuterRect).Min;
    IVar5 = (table->OuterRect).Max;
    break;
  case 1:
    IVar3 = (table->InnerRect).Min;
    IVar5 = (table->InnerRect).Max;
    break;
  case 2:
    IVar3 = (table->WorkRect).Min;
    IVar5 = (table->WorkRect).Max;
    break;
  case 3:
    IVar3 = (table->HostClipRect).Min;
    IVar5 = (table->HostClipRect).Max;
    break;
  case 4:
    IVar3 = (table->InnerClipRect).Min;
    IVar5 = (table->InnerClipRect).Max;
    break;
  case 5:
    IVar3 = (table->BgClipRect).Min;
    IVar5 = (table->BgClipRect).Max;
    break;
  case 6:
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    fVar2 = (table->InnerClipRect).Min.y;
    fVar6 = pIVar1->MinX;
    fVar7 = pIVar1->MaxX;
    fVar4 = table->LastOuterHeight;
    goto LAB_00143d52;
  case 7:
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    fVar6 = pIVar1->WorkMinX;
    fVar7 = pIVar1->WorkMaxX;
    fVar2 = (table->WorkRect).Min.y;
    fVar4 = (table->WorkRect).Max.y;
    goto LAB_00143d56;
  case 8:
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    IVar3 = (pIVar1->ClipRect).Min;
    IVar5 = (pIVar1->ClipRect).Max;
    break;
  case 9:
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    fVar2 = (table->InnerClipRect).Min.y;
    fVar6 = pIVar1->WorkMinX;
    fVar7 = pIVar1->ContentMaxXHeadersUsed;
    goto LAB_00143d4a;
  case 10:
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    fVar2 = (table->InnerClipRect).Min.y;
    fVar6 = pIVar1->WorkMinX;
    fVar7 = pIVar1->ContentMaxXHeadersIdeal;
    goto LAB_00143d4a;
  case 0xb:
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    fVar2 = (table->InnerClipRect).Min.y;
    fVar6 = pIVar1->WorkMinX;
    fVar7 = pIVar1->ContentMaxXFrozen;
LAB_00143d4a:
    fVar4 = table->LastFirstRowHeight;
LAB_00143d52:
    fVar4 = fVar4 + fVar2;
LAB_00143d56:
    IVar3.y = fVar2;
    IVar3.x = fVar6;
    IVar5.y = fVar4;
    IVar5.x = fVar7;
    break;
  case 0xc:
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    IVar3.y = (table->InnerClipRect).Min.y + table->LastFirstRowHeight;
    IVar3.x = pIVar1->WorkMinX;
    IVar5.y = (table->InnerClipRect).Max.y;
    IVar5.x = pIVar1->ContentMaxXUnfrozen;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x4126,
                  "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetTableRect(ImGuiTable *, int, int)"
                 );
  }
  IVar8.Max = IVar5;
  IVar8.Min = IVar3;
  return IVar8;
}

Assistant:

static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }